

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cc
# Opt level: O3

EventLoop * __thiscall tt::net::EventLoopThread::startLoop(EventLoopThread *this)

{
  if ((this->m_thread).m_started != true) {
    Thread::start(&this->m_thread);
    pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
    while (this->m_loop == (EventLoop *)0x0) {
      pthread_cond_wait((pthread_cond_t *)&(this->m_cond).m_cond,
                        (pthread_mutex_t *)(this->m_cond).m_mutex);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return this->m_loop;
  }
  __assert_fail("!m_thread.started()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/EventLoopThread.cc"
                ,0x1f,"EventLoop *tt::net::EventLoopThread::startLoop()");
}

Assistant:

EventLoop* EventLoopThread::startLoop(){

	assert(!m_thread.started());
	m_thread.start();

	{
		MutexLockGuard lock(m_mutex);

		//一直等到 htreadFun 在Thread 里真正跑起来
		
		while(m_loop == NULL) m_cond.wait();
	}

	return m_loop;
}